

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

cmListFileBacktrace * __thiscall
cmListFileBacktrace::Push
          (cmListFileBacktrace *__return_storage_ptr__,cmListFileBacktrace *this,string *file)

{
  cmListFileContext lfc;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28;
  
  local_68._8_8_ = 0;
  local_68[0x10] = '\0';
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_28 = 0;
  local_68._0_8_ = local_68 + 0x10;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_assign((string *)&local_48);
  cmListFileBacktrace(__return_storage_ptr__,&this->Bottom,this->Cur,(cmListFileContext *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,
                    CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Push(std::string const& file) const
{
  // We are entering a file-level scope but have not yet reached
  // any specific line or command invocation within it.  This context
  // is useful to print when it is at the top but otherwise can be
  // skipped during call stack printing.
  cmListFileContext lfc;
  lfc.FilePath = file;
  return cmListFileBacktrace(this->Bottom, this->Cur, lfc);
}